

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelValues * __thiscall
pbrt::Image::L1Error
          (ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,Image *ref,
          Image *errorImage)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  size_t sVar2;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar3;
  float value;
  ImageChannelDesc *pIVar4;
  Allocator alloc;
  ulong uVar5;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar9;
  long lVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  size_t sVar12;
  Point2i PVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  allocator_type local_201;
  long local_200;
  ImageChannelDesc *local_1f8;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Image *local_1c0;
  vector<double,_std::allocator<double>_> sumError;
  ImageChannelDesc refDesc;
  ColorEncodingHandle local_150;
  Point2i va;
  int local_140;
  undefined4 uStack_13c;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ColorEncodingHandle local_98;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_90;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_70;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_50;
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumError,(desc->offset).nStored,(value_type_conflict6 *)&va,(allocator_type *)&refDesc
            );
  local_1f8 = desc;
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n =
       CONCAT44(uStack_13c,local_140) - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    LogFatal<char_const(&)[14]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x224,"Check failed: %s",(char (*) [14])"(bool)refDesc");
  }
  TVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = TVar1.x;
  auVar14._4_4_ = TVar1.y;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = vb.super_Tuple2<pbrt::Point2,_int>.x;
  auVar15._4_4_ = vb.super_Tuple2<pbrt::Point2,_int>.y;
  uVar5 = vpcmpd_avx512vl(auVar14,auVar15,4);
  va.super_Tuple2<pbrt::Point2,_int> = TVar1;
  if ((uVar5 & 3) == 0) {
    local_1c0 = this;
    if (errorImage != (Image *)0x0) {
      pbVar7 = (this->channelNames).ptr;
      __first = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->channelNames).field_2;
      if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        __first = pbVar7;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::__cxx11::string_const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vb,__first,
                 __first + (this->channelNames).nStored,&local_201);
      PVar13.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      lVar10 = (long)local_1e8 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      local_150.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar10 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar13.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar1,channels,&local_150,alloc);
      (errorImage->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_140;
      errorImage->format = va.super_Tuple2<pbrt::Point2,_int>.x;
      (errorImage->resolution).super_Tuple2<pbrt::Point2,_int>.x =
           va.super_Tuple2<pbrt::Point2,_int>.y;
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&errorImage->channelNames,&local_138);
      (errorImage->encoding).
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (uintptr_t)
              local_98.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&errorImage->p8,&local_90);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&errorImage->p16,&local_70);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&errorImage->p32,&local_50);
      local_50.nStored = 0;
      (*(local_50.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_50.alloc.memoryResource,local_50.ptr,local_50.nAlloc << 2,4);
      this = local_1c0;
      local_70.nStored = 0;
      (*(local_70.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_70.alloc.memoryResource,local_70.ptr,local_70.nAlloc * 2,2);
      local_90.nStored = 0;
      (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
    }
    if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
      local_200 = 0;
      do {
        if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
          uVar5 = local_200 << 0x20;
          uVar8 = 0;
          do {
            pIVar4 = local_1f8;
            PVar13.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar5 | uVar8);
            GetChannels((ImageChannelValues *)&va,this,PVar13,local_1f8,(WrapMode2D)0x200000002);
            GetChannels((ImageChannelValues *)&vb,ref,PVar13,&refDesc,(WrapMode2D)0x200000002);
            if ((pIVar4->offset).nStored != 0) {
              uVar11 = 0;
              do {
                pIVar6 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(uStack_13c,local_140);
                if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(uStack_13c,local_140) ==
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  pIVar6 = &local_138;
                }
                pbVar7 = local_1e8;
                if (local_1e8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pbVar7 = &local_1e0;
                }
                value = *(float *)((long)&(pIVar6->alloc).memoryResource + uVar11 * 4) -
                        *(float *)((long)&(pbVar7->_M_dataplus)._M_p + uVar11 * 4);
                if (ABS(value) != INFINITY) {
                  sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] =
                       (double)value +
                       sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11];
                  if (errorImage != (Image *)0x0) {
                    SetChannel(errorImage,PVar13,(int)uVar11,value);
                  }
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 < (local_1f8->offset).nStored);
            }
            local_1e0.field_2._8_8_ = 0;
            (**(code **)(*(long *)vb.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (vb.super_Tuple2<pbrt::Point2,_int>,local_1e8,
                       local_1e0.field_2._M_allocated_capacity << 2,4);
            local_138.field_2.fixed[0]._M_string_length = 0;
            (**(code **)(*(long *)va.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (va.super_Tuple2<pbrt::Point2,_int>,CONCAT44(uStack_13c,local_140),
                       (long)local_138.field_2.fixed[0]._M_dataplus._M_p << 2,4);
            uVar8 = uVar8 + 1;
            this = local_1c0;
          } while ((long)uVar8 < (long)(local_1c0->resolution).super_Tuple2<pbrt::Point2,_int>.x);
        }
        local_200 = local_200 + 1;
      } while (local_200 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    pIVar4 = local_1f8;
    sVar2 = (local_1f8->offset).nStored;
    vb.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int> & 0xffffffff00000000;
    va.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource()
    ;
    InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
              (&__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,sVar2,
               (float *)&vb,(polymorphic_allocator<float> *)&va);
    sVar2 = (pIVar4->offset).nStored;
    if (sVar2 != 0) {
      paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      paVar9 = &(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar3 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar9 = paVar3;
      }
      sVar12 = 0;
      do {
        TVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
        paVar9->fixed[sVar12] =
             (float)(sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar12] / (double)(TVar1.y * TVar1.x));
        sVar12 = sVar12 + 1;
      } while (sVar2 != sVar12);
    }
    refDesc.offset.nStored = 0;
    (*(refDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (refDesc.offset.alloc.memoryResource,refDesc.offset.ptr,refDesc.offset.nAlloc << 2,4);
    if (sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x225,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x5d0ace,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x5d0ace,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::L1Error(const ImageChannelDesc &desc, const Image &ref,
                                  Image *errorImage) const {
    std::vector<double> sumError(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (errorImage)
        *errorImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float error = v[c] - vref[c];
                if (std::isinf(error))
                    continue;
                sumError[c] += error;
                if (errorImage)
                    errorImage->SetChannel({x, y}, c, error);
            }
        }

    ImageChannelValues error(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        error[c] = sumError[c] / (Resolution().x * Resolution().y);
    return error;
}